

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_matrix4d::test_method(value_matrix4d *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  Scalar *pSVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_550;
  basic_cstring<const_char> local_530;
  assertion_result local_520;
  basic_cstring<const_char> local_508;
  basic_cstring<const_char> local_4f8;
  basic_cstring<const_char> local_4e8;
  output_test_stream local_4d8 [8];
  output_test_stream output_1;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_338;
  basic_cstring<const_char> local_318;
  assertion_result local_308;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  output_test_stream local_2c0 [8];
  output_test_stream output;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8 [2];
  Value local_b8 [8];
  Value value;
  Value local_a8 [8];
  Value value1;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_98 [8];
  Matrix4d avector1;
  value_matrix4d *this_local;
  
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_98);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero(local_98);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)local_98,0,0);
  *pSVar4 = 0.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)local_98,0,1);
  *pSVar4 = 1.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)local_98,1,0);
  *pSVar4 = 2.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)local_98,1,1);
  *pSVar4 = 3.5;
  dynamicgraph::command::Value::Value(local_a8,(Matrix *)local_98);
  dynamicgraph::command::Value::Value(local_b8,local_a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_d8,0x170,&local_e8);
    bVar2 = dynamicgraph::command::Value::operator==(local_a8,local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_100,(bool)(bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"value1 == value",0xf);
    boost::unit_test::operator<<(&local_120,plVar5,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&local_140,0x170,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d0);
  boost::test_tools::output_test_stream::output_test_stream(local_2c0,&local_2d0,1);
  dynamicgraph::command::operator<<((ostream *)local_2c0,local_a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e0,0x178,&local_2f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_318,
               "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
              );
    boost::test_tools::output_test_stream::is_equal(&local_308,local_2c0,&local_318,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "output.is_equal(\"Type=matrix4d, value=0.5 1.5   0   0\\n\" \"2.5 3.5   0   0\\n  0   0   0   0\\n\" \"  0   0   0   0\")"
               ,0x70);
    boost::unit_test::operator<<(&local_338,plVar5,&local_348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_308,&local_338,&local_358,0x178,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_338);
    boost::test_tools::assertion_result::~assertion_result(&local_308);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_2c0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4e8);
  boost::test_tools::output_test_stream::output_test_stream(local_4d8,&local_4e8,1);
  dynamicgraph::command::operator<<((ostream *)local_4d8,local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_508);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4f8,0x181,&local_508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_530,
               "Type=matrix4d, value=0.5 1.5   0   0\n2.5 3.5   0   0\n  0   0   0   0\n  0   0   0   0"
              );
    boost::test_tools::output_test_stream::is_equal(&local_520,local_4d8,&local_530,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "output.is_equal(\"Type=matrix4d, value=0.5 1.5   0   0\\n\" \"2.5 3.5   0   0\\n  0   0   0   0\\n\" \"  0   0   0   0\")"
               ,0x70);
    boost::unit_test::operator<<(&local_550,plVar5,&local_560);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_520,&local_550,&local_570,0x181,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_550);
    boost::test_tools::assertion_result::~assertion_result(&local_520);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_4d8);
  dynamicgraph::command::Value::~Value(local_b8);
  dynamicgraph::command::Value::~Value(local_a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_matrix4d) {
  using dg::command::Value;

  Eigen::Matrix4d avector1;
  avector1.setZero();
  avector1(0, 0) = 0.5;
  avector1(0, 1) = 1.5;
  avector1(1, 0) = 2.5;
  avector1(1, 1) = 3.5;
  Value value1(avector1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(
        output.is_equal("Type=matrix4d, value=0.5 1.5   0   0\n"
                        "2.5 3.5   0   0\n  0   0   0   0\n"
                        "  0   0   0   0"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(
        output.is_equal("Type=matrix4d, value=0.5 1.5   0   0\n"
                        "2.5 3.5   0   0\n  0   0   0   0\n"
                        "  0   0   0   0"));
  }
}